

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_policy_traits.h
# Opt level: O0

void absl::lts_20240722::container_internal::
     common_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,void>
     ::transfer_impl<std::allocator<std::basic_string_view<char,std::char_traits<char>>>,void>
               (undefined8 param_1,remove_const_t<slot_type>_conflict14 *new_slot,
               remove_const_t<slot_type>_conflict14 *old_slot)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *param_0_local;
  
  pbVar1 = element<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>>
                     (new_slot);
  pbVar1 = std::launder<std::basic_string_view<char,std::char_traits<char>>>(pbVar1);
  pbVar2 = element<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>>
                     (old_slot);
  pbVar1->_M_len = pbVar2->_M_len;
  pbVar1->_M_str = pbVar2->_M_str;
  return;
}

Assistant:

static std::true_type transfer_impl(Alloc*, slot_type* new_slot,
                                      slot_type* old_slot, Rank1) {
    // TODO(b/247130232): remove casts after fixing warnings.
    // TODO(b/251814870): remove casts after fixing warnings.
    std::memcpy(
        static_cast<void*>(std::launder(
            const_cast<std::remove_const_t<value_type>*>(&element(new_slot)))),
        static_cast<const void*>(&element(old_slot)), sizeof(value_type));
    return {};
  }